

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MixedApiCase::renderTo(MixedApiCase *this,Surface *dst)

{
  int iVar1;
  deUint32 dVar2;
  GLuint attribindex;
  int height;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *log;
  PixelBufferAccess local_98;
  GLuint local_6c;
  GLuint local_68;
  int bindingPoint2;
  int bindingPoint1;
  int maxUsedLocation;
  Buffer dummyBuffer;
  int colorLoc;
  undefined1 local_30 [4];
  int positionLoc;
  CallLogWrapper gl;
  Surface *dst_local;
  MixedApiCase *this_local;
  
  gl._16_8_ = dst;
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_BindingRenderCase).super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  log = tcu::TestContext::getLog
                  ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_30,(Functions *)CONCAT44(extraout_var,iVar1),log);
  dVar2 = glu::ShaderProgram::getProgram((this->super_BindingRenderCase).m_program);
  attribindex = glu::CallLogWrapper::glGetAttribLocation
                          ((CallLogWrapper *)local_30,dVar2,"a_position");
  dVar2 = glu::ShaderProgram::getProgram((this->super_BindingRenderCase).m_program);
  dummyBuffer.super_ObjectWrapper.m_object =
       glu::CallLogWrapper::glGetAttribLocation((CallLogWrapper *)local_30,dVar2,"a_color");
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_BindingRenderCase).super_TestCase.m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&bindingPoint1,pRVar4);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_30,true);
  glu::CallLogWrapper::glClearColor((CallLogWrapper *)local_30,0.0,0.0,0.0,0.0);
  glu::CallLogWrapper::glClear((CallLogWrapper *)local_30,0x4000);
  iVar1 = tcu::Surface::getWidth((Surface *)gl._16_8_);
  height = tcu::Surface::getHeight((Surface *)gl._16_8_);
  glu::CallLogWrapper::glViewport((CallLogWrapper *)local_30,0,0,iVar1,height);
  glu::CallLogWrapper::glBindVertexArray
            ((CallLogWrapper *)local_30,(this->super_BindingRenderCase).m_vao);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
  glu::checkError(GVar3,"set vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x471);
  dVar2 = glu::ShaderProgram::getProgram((this->super_BindingRenderCase).m_program);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_30,dVar2);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
  glu::checkError(GVar3,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x474);
  switch(this->m_case) {
  case CASE_CHANGE_BUFFER:
    dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&bindingPoint1);
    glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)local_30,0x8892,dVar2);
    glu::CallLogWrapper::glVertexAttribPointer
              ((CallLogWrapper *)local_30,attribindex,4,0x1406,'\0',0x20,(void *)0x0);
    glu::CallLogWrapper::glVertexAttribPointer
              ((CallLogWrapper *)local_30,dummyBuffer.super_ObjectWrapper.m_object,4,0x1406,'\0',
               0x20,(void *)0x10);
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)local_30,attribindex,this->m_buffer,0,0x20);
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)local_30,dummyBuffer.super_ObjectWrapper.m_object,this->m_buffer,
               0x10,0x20);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
    glu::checkError(GVar3,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x485);
    break;
  case CASE_CHANGE_BUFFER_OFFSET:
    glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)local_30,0x8892,this->m_buffer);
    glu::CallLogWrapper::glVertexAttribPointer
              ((CallLogWrapper *)local_30,attribindex,4,0x1406,'\0',0x20,(void *)0x0);
    glu::CallLogWrapper::glVertexAttribPointer
              ((CallLogWrapper *)local_30,dummyBuffer.super_ObjectWrapper.m_object,4,0x1406,'\0',
               0x20,(void *)0x0);
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)local_30,attribindex,this->m_buffer,0,0x20);
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)local_30,dummyBuffer.super_ObjectWrapper.m_object,this->m_buffer,
               0x10,0x20);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
    glu::checkError(GVar3,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x496);
    break;
  case CASE_CHANGE_BUFFER_STRIDE:
    glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)local_30,0x8892,this->m_buffer);
    glu::CallLogWrapper::glVertexAttribPointer
              ((CallLogWrapper *)local_30,attribindex,4,0x1406,'\0',8,(void *)0x0);
    glu::CallLogWrapper::glVertexAttribPointer
              ((CallLogWrapper *)local_30,dummyBuffer.super_ObjectWrapper.m_object,4,0x1406,'\0',4,
               (void *)0x0);
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)local_30,attribindex,this->m_buffer,0,0x20);
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)local_30,dummyBuffer.super_ObjectWrapper.m_object,this->m_buffer,
               0x10,0x20);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
    glu::checkError(GVar3,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x4a7);
    break;
  case CASE_CHANGE_BINDING_POINT:
    bindingPoint2 = de::max<int>(attribindex,dummyBuffer.super_ObjectWrapper.m_object);
    local_68 = bindingPoint2 + 1;
    local_6c = bindingPoint2 + 2;
    glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)local_30,0x8892,this->m_buffer);
    glu::CallLogWrapper::glVertexAttribPointer
              ((CallLogWrapper *)local_30,local_68,4,0x1406,'\0',0x20,(void *)0x0);
    glu::CallLogWrapper::glVertexAttribPointer
              ((CallLogWrapper *)local_30,local_6c,4,0x1406,'\0',0x20,(void *)0x10);
    glu::CallLogWrapper::glVertexAttribFormat
              ((CallLogWrapper *)local_30,attribindex,4,0x1406,'\0',0);
    glu::CallLogWrapper::glVertexAttribFormat
              ((CallLogWrapper *)local_30,dummyBuffer.super_ObjectWrapper.m_object,4,0x1406,'\0',0);
    glu::CallLogWrapper::glVertexAttribBinding((CallLogWrapper *)local_30,attribindex,local_68);
    glu::CallLogWrapper::glVertexAttribBinding
              ((CallLogWrapper *)local_30,dummyBuffer.super_ObjectWrapper.m_object,local_6c);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
    glu::checkError(GVar3,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x4bf);
  }
  glu::CallLogWrapper::glEnableVertexAttribArray((CallLogWrapper *)local_30,attribindex);
  glu::CallLogWrapper::glEnableVertexAttribArray
            ((CallLogWrapper *)local_30,dummyBuffer.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)local_30,4,0,0x960);
  glu::CallLogWrapper::glFinish((CallLogWrapper *)local_30);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)local_30,0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_30,0);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
  glu::checkError(GVar3,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x4cf);
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_BindingRenderCase).super_TestCase.m_context);
  tcu::Surface::getAccess(&local_98,(Surface *)gl._16_8_);
  glu::readPixels(pRVar4,0,0,&local_98);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&bindingPoint1);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_30);
  return;
}

Assistant:

void MixedApiCase::renderTo (tcu::Surface& dst)
{
	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	const int				positionLoc		= gl.glGetAttribLocation(m_program->getProgram(), "a_position");
	const int				colorLoc		= gl.glGetAttribLocation(m_program->getProgram(), "a_color");
	glu::Buffer				dummyBuffer		(m_context.getRenderContext());

	gl.enableLogging(true);

	gl.glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.glClear(GL_COLOR_BUFFER_BIT);
	gl.glViewport(0, 0, dst.getWidth(), dst.getHeight());
	gl.glBindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set vao");

	gl.glUseProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "use program");

	switch (m_case)
	{
		case CASE_CHANGE_BUFFER:
		{
			// bind data using old api

			gl.glBindBuffer(GL_ARRAY_BUFFER, *dummyBuffer);
			gl.glVertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(2 * sizeof(tcu::Vec4)), (const deUint8*)DE_NULL);
			gl.glVertexAttribPointer(colorLoc,    4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(2 * sizeof(tcu::Vec4)), (const deUint8*)DE_NULL + sizeof(tcu::Vec4));

			// change buffer with vertex_attrib_binding

			gl.glBindVertexBuffer(positionLoc, m_buffer, 0,                 (glw::GLsizei)(2 * sizeof(tcu::Vec4)));
			gl.glBindVertexBuffer(colorLoc,    m_buffer, sizeof(tcu::Vec4), (glw::GLsizei)(2 * sizeof(tcu::Vec4)));

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");
			break;
		}

		case CASE_CHANGE_BUFFER_OFFSET:
		{
			// bind data using old api

			gl.glBindBuffer(GL_ARRAY_BUFFER, m_buffer);
			gl.glVertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(2 * sizeof(tcu::Vec4)), (const deUint8*)DE_NULL);
			gl.glVertexAttribPointer(colorLoc,    4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(2 * sizeof(tcu::Vec4)), (const deUint8*)DE_NULL);

			// change buffer offset with vertex_attrib_binding

			gl.glBindVertexBuffer(positionLoc, m_buffer, 0,                 (glw::GLsizei)(2 * sizeof(tcu::Vec4)));
			gl.glBindVertexBuffer(colorLoc,    m_buffer, sizeof(tcu::Vec4), (glw::GLsizei)(2 * sizeof(tcu::Vec4)));

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");
			break;
		}

		case CASE_CHANGE_BUFFER_STRIDE:
		{
			// bind data using old api

			gl.glBindBuffer(GL_ARRAY_BUFFER, m_buffer);
			gl.glVertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 8, (const deUint8*)DE_NULL);
			gl.glVertexAttribPointer(colorLoc,    4, GL_FLOAT, GL_FALSE, 4, (const deUint8*)DE_NULL);

			// change buffer stride with vertex_attrib_binding

			gl.glBindVertexBuffer(positionLoc, m_buffer, 0,                 (glw::GLsizei)(2 * sizeof(tcu::Vec4)));
			gl.glBindVertexBuffer(colorLoc,    m_buffer, sizeof(tcu::Vec4), (glw::GLsizei)(2 * sizeof(tcu::Vec4)));

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");
			break;
		}

		case CASE_CHANGE_BINDING_POINT:
		{
			const int maxUsedLocation	= de::max(positionLoc, colorLoc);
			const int bindingPoint1		= maxUsedLocation + 1;
			const int bindingPoint2		= maxUsedLocation + 2;

			// bind data using old api

			gl.glBindBuffer(GL_ARRAY_BUFFER, m_buffer);
			gl.glVertexAttribPointer(bindingPoint1, 4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(2 * sizeof(tcu::Vec4)), (const deUint8*)DE_NULL);
			gl.glVertexAttribPointer(bindingPoint2, 4, GL_FLOAT, GL_FALSE, (glw::GLsizei)(2 * sizeof(tcu::Vec4)), (const deUint8*)DE_NULL + sizeof(tcu::Vec4));

			// change buffer binding point with vertex_attrib_binding

			gl.glVertexAttribFormat(positionLoc, 4, GL_FLOAT, GL_FALSE, 0);
			gl.glVertexAttribFormat(colorLoc, 4, GL_FLOAT, GL_FALSE, 0);

			gl.glVertexAttribBinding(positionLoc, bindingPoint1);
			gl.glVertexAttribBinding(colorLoc, bindingPoint2);

			GLU_EXPECT_NO_ERROR(gl.glGetError(), "");
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	// draw
	gl.glEnableVertexAttribArray(positionLoc);
	gl.glEnableVertexAttribArray(colorLoc);
	gl.glDrawArrays(GL_TRIANGLES, 0, 6*GRID_SIZE*GRID_SIZE);

	gl.glFinish();
	gl.glBindVertexArray(0);
	gl.glUseProgram(0);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "clean");

	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());
}